

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lejp.c
# Opt level: O2

char cb(lejp_ctx *ctx,char reason)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  char buf [1024];
  undefined1 local_38 [8];
  
  bVar1 = ctx->sp;
  pcVar5 = buf;
  for (lVar6 = 0x400; (uint)bVar1 + (int)lVar6 != 0x400; lVar6 = lVar6 + -1) {
    *pcVar5 = ' ';
    pcVar5 = pcVar5 + 1;
  }
  *pcVar5 = '\0';
  if ((reason & 0x40U) == 0) {
    if (reason == '\x05') {
      _lws_log(4,"%spath: \'%s\' (LEJPCB_PAIR_NAME)\n",buf,ctx->path);
    }
    else if (reason == '\x03') {
      _lws_log(4,"%sParsing Completed (LEJPCB_COMPLETE)\n",buf);
    }
    _lws_log(4,"%s%s: path %s match %d statckp %d\r\n",buf,reason_names[(byte)reason & 0x3f],
             ctx->path,(ulong)ctx->path_match,(uint)ctx->pst[ctx->pst_sp].ppos);
  }
  else {
    iVar2 = lws_snprintf(pcVar5,-lVar6,"   value \'%s\' ",ctx->buf);
    if (ctx->ipos != '\0') {
      iVar3 = lws_snprintf(pcVar5 + iVar2,iVar2 - lVar6,"(array indexes: ");
      pcVar5 = pcVar5 + iVar2 + iVar3;
      for (uVar4 = 0; uVar4 < ctx->ipos; uVar4 = uVar4 + 1) {
        iVar2 = lws_snprintf(pcVar5,(long)pcVar5 - (long)local_38,"%d ",(ulong)ctx->i[uVar4]);
        pcVar5 = pcVar5 + iVar2;
      }
      lws_snprintf(pcVar5,(long)pcVar5 - (long)local_38,") ");
    }
    _lws_log(4,"%s (%s)\r\n",buf,reason_names[(byte)reason & 0x3f]);
  }
  return '\0';
}

Assistant:

static signed char
cb(struct lejp_ctx *ctx, char reason)
{
	char buf[1024], *p = buf, *end = &buf[sizeof(buf)];
	int n;

	for (n = 0; n < ctx->sp; n++)
		*p++ = ' ';
	*p = '\0';

	if (reason & LEJP_FLAG_CB_IS_VALUE) {
		p += lws_snprintf(p, p - end, "   value '%s' ", ctx->buf);
		if (ctx->ipos) {
			int n;

			p += lws_snprintf(p, p - end, "(array indexes: ");
			for (n = 0; n < ctx->ipos; n++)
				p += lws_snprintf(p, p - end, "%d ", ctx->i[n]);
			p += lws_snprintf(p, p - end, ") ");
		}
		lwsl_notice("%s (%s)\r\n", buf,
		       reason_names[(unsigned int)
			(reason) & (LEJP_FLAG_CB_IS_VALUE - 1)]);

		(void)reason_names; /* NO_LOGS... */
		return 0;
	}

	switch (reason) {
	case LEJPCB_COMPLETE:
		lwsl_notice("%sParsing Completed (LEJPCB_COMPLETE)\n", buf);
		break;
	case LEJPCB_PAIR_NAME:
		lwsl_notice("%spath: '%s' (LEJPCB_PAIR_NAME)\n", buf, ctx->path);
		break;
	}

	lwsl_notice("%s%s: path %s match %d statckp %d\r\n", buf, reason_names[(unsigned int)
		(reason) & (LEJP_FLAG_CB_IS_VALUE - 1)], ctx->path,
		ctx->path_match, ctx->pst[ctx->pst_sp].ppos);

	return 0;
}